

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

QDebug operator<<(QDebug stream,QFont *font)

{
  double dVar1;
  int iVar2;
  QDebug *pQVar3;
  QFontPrivate *pQVar4;
  bool bVar5;
  QFont *in_RDX;
  int property;
  uint uVar6;
  char *t;
  QDebug QVar7;
  long in_FS_OFFSET;
  double dVar8;
  QDebug local_130;
  undefined1 local_128 [8];
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QDebug local_f0;
  undefined1 local_e8 [8];
  QDebug local_e0;
  QDebug local_d8;
  undefined1 local_d0 [8];
  QDebug local_c8;
  undefined1 local_c0 [8];
  QDebug local_b8;
  undefined1 local_b0 [8];
  QDebug local_a8;
  undefined1 local_a0 [8];
  QDebug local_98;
  undefined1 local_90 [8];
  QDebug local_88;
  undefined1 local_80 [8];
  QDebugStateSaver saver_1;
  QDebug debug;
  QArrayDataPointer<char16_t> local_68;
  QDebugStateSaver saver;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)font);
  *(undefined2 *)&(((font->d).d.ptr)->request).styleName.d.size = 0x100;
  QDebug::operator<<((QDebug *)font,"QFont(");
  if (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) == 2) {
    QFont::toString((QString *)&local_68,in_RDX);
    pQVar3 = QDebug::operator<<((QDebug *)font,(QString *)&local_68);
    QDebug::operator<<(pQVar3,")");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    pQVar4 = (font->d).d.ptr;
    (font->d).d.ptr = (QFontPrivate *)0x0;
    *(QFontPrivate **)stream.stream = pQVar4;
  }
  else {
    local_68.size = 0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    debug.stream = (Stream *)&DAT_aaaaaaaaaaaaaaaa;
    QDebug::QDebug(&debug,(QString *)&local_68);
    (debug.stream)->space = false;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (QFontPrivate *)operator_new(0x98);
    QFontPrivate::QFontPrivate(pQVar4);
    QFont::QFont((QFont *)local_48,pQVar4);
    for (uVar6 = 2; uVar6 < 0xfffff; uVar6 = uVar6 * 2) {
      if (((in_RDX->resolve_mask & uVar6) != 0) ||
         (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 0)) {
        _saver_1 = &DAT_aaaaaaaaaaaaaaaa;
        QDebugStateSaver::QDebugStateSaver(&saver_1,(QDebug *)&debug);
        if (uVar6 == 0x10000) {
          QFont::styleName((QString *)&local_108,in_RDX);
          local_120.d = (((QString *)(local_48._0_8_ + 0x20))->d).d;
          local_120.ptr = *(char16_t **)(local_48._0_8_ + 0x28);
          local_120.size = *(qsizetype *)(local_48._0_8_ + 0x30);
          if (local_120.d != (Data *)0x0) {
            LOCK();
            ((local_120.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_120.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          bVar5 = comparesEqual((QString *)&local_108,(QString *)&local_120);
          if (bVar5) {
            iVar2 = *(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
            if (iVar2 == 1) goto LAB_0041ae01;
          }
          else {
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
          }
          pQVar3 = QDebug::operator<<(&debug,"styleName=");
          QFont::styleName((QString *)&local_108,in_RDX);
          QDebug::operator<<(pQVar3,(QString *)&local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
LAB_0041adf2:
          QDebug::operator<<(&debug,", ");
        }
        else {
          if (uVar6 == 4) {
            if (((char)((ulong)*(undefined8 *)(local_48._0_8_ + 0x68) >> 0x20) ==
                 (char)((ulong)*(undefined8 *)&(((in_RDX->d).d.ptr)->request).field_0x60 >> 0x20))
               && (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) == 1))
            goto LAB_0041ae01;
            (debug.stream)->verbosity = 1;
            local_88.stream = debug.stream;
            (debug.stream)->ref = (debug.stream)->ref + 1;
            QVar7.stream = (Stream *)local_80;
            pQVar3 = &local_88;
            operator<<(QVar7,(StyleHint)pQVar3);
LAB_0041ace9:
            QDebug::~QDebug((QDebug *)QVar7.stream);
LAB_0041acf1:
            QDebug::~QDebug(pQVar3);
            goto LAB_0041adf2;
          }
          if (uVar6 == 8) {
            if (((short)*(undefined4 *)&(((in_RDX->d).d.ptr)->request).field_0x60 ==
                 (short)*(undefined4 *)(local_48._0_8_ + 0x68)) &&
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) == 1))
            goto LAB_0041ae01;
            (debug.stream)->verbosity = 1;
            local_98.stream = debug.stream;
            (debug.stream)->ref = (debug.stream)->ref + 1;
            QVar7.stream = (Stream *)local_90;
            pQVar3 = &local_98;
            operator<<(QVar7,(StyleStrategy)pQVar3);
LAB_0041ac75:
            QDebug::~QDebug((QDebug *)QVar7.stream);
            goto LAB_0041acf1;
          }
          if (uVar6 == 0x10) {
            (debug.stream)->verbosity = 1;
            local_a8.stream = debug.stream;
            (debug.stream)->ref = (debug.stream)->ref + 1;
            QVar7.stream = (Stream *)local_a0;
            pQVar3 = &local_a8;
            operator<<(QVar7,(Weight)pQVar3);
            goto LAB_0041ace9;
          }
          if (uVar6 == 0x20) {
            if ((((*(uint *)(local_48._0_8_ + 0x68) ^
                  *(uint *)&(((in_RDX->d).d.ptr)->request).field_0x60) & 0x30000000) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              (debug.stream)->verbosity = 0;
              local_b8.stream = debug.stream;
              (debug.stream)->ref = (debug.stream)->ref + 1;
              QVar7.stream = (Stream *)local_b0;
              pQVar3 = &local_b8;
              operator<<(QVar7,(Style)pQVar3);
              goto LAB_0041ace9;
            }
          }
          else if (uVar6 == 0x40) {
            if ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 1) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              pQVar3 = QDebug::operator<<(&debug,"underline=");
              bVar5 = (bool)(((in_RDX->d).d.ptr)->field_0x7c & 1);
LAB_0041ad82:
              QDebug::operator<<(pQVar3,bVar5);
              goto LAB_0041adf2;
            }
          }
          else if (uVar6 == 0x80) {
            if ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 2) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              pQVar3 = QDebug::operator<<(&debug,"overline=");
              bVar5 = (bool)((((in_RDX->d).d.ptr)->field_0x7c & 2) >> 1);
              goto LAB_0041ad82;
            }
          }
          else if (uVar6 == 0x100) {
            if ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 4) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              pQVar3 = QDebug::operator<<(&debug,"strikeOut=");
              bVar5 = (bool)((((in_RDX->d).d.ptr)->field_0x7c & 4) >> 2);
              goto LAB_0041ad82;
            }
          }
          else if (uVar6 == 0x200) {
            if ((((*(ulong *)(local_48._0_8_ + 0x68) & 0x4000000000000) != 0) !=
                 ((*(ulong *)&(((in_RDX->d).d.ptr)->request).field_0x60 & 0x4000000000000) != 0)) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              pQVar3 = QDebug::operator<<(&debug,"fixedPitch=");
              bVar5 = (*(ulong *)&(((in_RDX->d).d.ptr)->request).field_0x60 & 0x4000000000000) != 0;
              goto LAB_0041ad82;
            }
          }
          else if (uVar6 == 0x400) {
            if ((((*(uint *)(local_48._0_8_ + 0x68) ^
                  *(uint *)&(((in_RDX->d).d.ptr)->request).field_0x60) & 0xfff0000) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              (debug.stream)->verbosity = 0;
              local_c8.stream = debug.stream;
              (debug.stream)->ref = (debug.stream)->ref + 1;
              QVar7.stream = (Stream *)local_c0;
              pQVar3 = &local_c8;
              operator<<(QVar7,(Stretch)pQVar3);
              goto LAB_0041ace9;
            }
          }
          else if (uVar6 == 0x800) {
            if ((((((in_RDX->d).d.ptr)->field_0x7c ^ *(byte *)(local_48._0_8_ + 0x7c)) & 8) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              pQVar3 = QDebug::operator<<(&debug,"kerning=");
              bVar5 = (bool)((((in_RDX->d).d.ptr)->field_0x7c & 8) >> 3);
              goto LAB_0041ad82;
            }
          }
          else if (uVar6 == 0x1000) {
            if ((((*(byte *)(local_48._0_8_ + 0x7c) ^ ((in_RDX->d).d.ptr)->field_0x7c) & 0x70) != 0)
               || (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              (debug.stream)->verbosity = 0;
              local_d8.stream = debug.stream;
              (debug.stream)->ref = (debug.stream)->ref + 1;
              QVar7.stream = (Stream *)local_d0;
              pQVar3 = &local_d8;
              operator<<(QVar7,(Capitalization)pQVar3);
              goto LAB_0041ace9;
            }
          }
          else if (uVar6 == 0x2000) {
            dVar1 = (double)(((in_RDX->d).d.ptr)->letterSpacing).val * 0.015625;
            dVar8 = (double)((QFixed *)(local_48._0_8_ + 0x80))->val * 0.015625;
            if (((dVar1 != dVar8) || (NAN(dVar1) || NAN(dVar8))) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              pQVar3 = QDebug::operator<<(&debug,"letterSpacing=");
              QDebug::operator<<(pQVar3,(double)(((in_RDX->d).d.ptr)->letterSpacing).val * 0.015625)
              ;
              (debug.stream)->verbosity = 0;
              pQVar3 = QDebug::operator<<(&debug," (");
              local_e0.stream = pQVar3->stream;
              (local_e0.stream)->ref = (local_e0.stream)->ref + 1;
              QVar7.stream = (Stream *)&local_108;
              pQVar3 = &local_e0;
              operator<<(QVar7,(SpacingType)pQVar3);
              QDebug::operator<<((QDebug *)QVar7.stream,")");
              goto LAB_0041ac75;
            }
          }
          else if (uVar6 == 0x8000) {
            if ((((*(uint *)(local_48._0_8_ + 0x68) ^
                  *(uint *)&(((in_RDX->d).d.ptr)->request).field_0x60) & 0xc0000000) != 0) ||
               (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) != 1)) {
              (debug.stream)->verbosity = 0;
              local_f0.stream = debug.stream;
              (debug.stream)->ref = (debug.stream)->ref + 1;
              QVar7.stream = (Stream *)local_e8;
              pQVar3 = &local_f0;
              operator<<(QVar7,(HintingPreference)pQVar3);
              goto LAB_0041ace9;
            }
          }
          else if (uVar6 == 2) {
            pQVar4 = (in_RDX->d).d.ptr;
            dVar1 = (pQVar4->request).pointSize;
            if (0.0 <= dVar1) {
              pQVar3 = QDebug::operator<<(&debug,dVar1);
              t = "pt";
            }
            else {
              pQVar3 = QDebug::operator<<(&debug,(int)(pQVar4->request).pixelSize);
              t = "px";
            }
            QDebug::operator<<(pQVar3,t);
            goto LAB_0041adf2;
          }
        }
LAB_0041ae01:
        QDebugStateSaver::~QDebugStateSaver(&saver_1);
      }
    }
    if (*(int *)((long)&(((font->d).d.ptr)->request).styleName.d.size + 4) < 1) {
      QString::chop((longlong)&local_68);
    }
    else {
      (debug.stream)->verbosity = 0;
      pQVar3 = QDebug::operator<<(&debug,"resolveMask=");
      local_130.stream = pQVar3->stream;
      (local_130.stream)->ref = (local_130.stream)->ref + 1;
      operator<<<QFlags<QFont::ResolveProperties>,_true>
                ((Stream *)local_128,
                 (QFlagsStorageHelper<QFont::ResolveProperties,_4>)SUB84(&local_130,0));
      QDebug::~QDebug((QDebug *)local_128);
      QDebug::~QDebug(&local_130);
    }
    pQVar3 = QDebug::operator<<((QDebug *)font,(QString *)&local_68);
    QDebug::operator<<(pQVar3,')');
    pQVar4 = (font->d).d.ptr;
    (font->d).d.ptr = (QFontPrivate *)0x0;
    *(QFontPrivate **)stream.stream = pQVar4;
    QFont::~QFont((QFont *)local_48);
    QDebug::~QDebug(&debug);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)stream.stream;
}

Assistant:

QDebug operator<<(QDebug stream, const QFont &font)
{
    QDebugStateSaver saver(stream);
    stream.nospace().noquote();
    stream << "QFont(";

    if (stream.verbosity() == QDebug::DefaultVerbosity) {
        stream << font.toString() << ")";
        return stream;
    }

    QString fontDescription;
    QDebug debug(&fontDescription);
    debug.nospace();

    const QFont defaultFont(new QFontPrivate);

    for (int property = QFont::SizeResolved; property < QFont::AllPropertiesResolved; property <<= 1) {
        const bool resolved = (font.resolve_mask & property) != 0;
        if (!resolved && stream.verbosity() == QDebug::MinimumVerbosity)
            continue;

        #define QFONT_DEBUG_SKIP_DEFAULT(prop) \
            if ((font.prop() == defaultFont.prop()) && stream.verbosity() == 1) \
                continue;

        QDebugStateSaver saver(debug);

        switch (property) {
        case QFont::SizeResolved:
            if (font.pointSizeF() >= 0)
                debug << font.pointSizeF() << "pt";
            else if (font.pixelSize() >= 0)
                debug << font.pixelSize() << "px";
            else
                Q_UNREACHABLE();
            break;
        case QFont::StyleHintResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleHint);
            debug.verbosity(1) << font.styleHint(); break;
        case QFont::StyleStrategyResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleStrategy);
            debug.verbosity(1) << font.styleStrategy(); break;
        case QFont::WeightResolved:
            debug.verbosity(1) << QFont::Weight(font.weight()); break;
        case QFont::StyleResolved:
            QFONT_DEBUG_SKIP_DEFAULT(style);
            debug.verbosity(0) << font.style(); break;
        case QFont::UnderlineResolved:
            QFONT_DEBUG_SKIP_DEFAULT(underline);
            debug << "underline=" << font.underline(); break;
        case QFont::OverlineResolved:
            QFONT_DEBUG_SKIP_DEFAULT(overline);
            debug << "overline=" << font.overline(); break;
        case QFont::StrikeOutResolved:
            QFONT_DEBUG_SKIP_DEFAULT(strikeOut);
            debug << "strikeOut=" << font.strikeOut(); break;
        case QFont::FixedPitchResolved:
            QFONT_DEBUG_SKIP_DEFAULT(fixedPitch);
            debug << "fixedPitch=" << font.fixedPitch(); break;
        case QFont::StretchResolved:
            QFONT_DEBUG_SKIP_DEFAULT(stretch);
            debug.verbosity(0) << QFont::Stretch(font.stretch()); break;
        case QFont::KerningResolved:
            QFONT_DEBUG_SKIP_DEFAULT(kerning);
            debug << "kerning=" << font.kerning(); break;
        case QFont::CapitalizationResolved:
            QFONT_DEBUG_SKIP_DEFAULT(capitalization);
            debug.verbosity(0) << font.capitalization(); break;
        case QFont::LetterSpacingResolved:
            QFONT_DEBUG_SKIP_DEFAULT(letterSpacing);
            debug << "letterSpacing=" << font.letterSpacing();
            debug.verbosity(0) << " (" << font.letterSpacingType() << ")";
            break;
        case QFont::HintingPreferenceResolved:
            QFONT_DEBUG_SKIP_DEFAULT(hintingPreference);
            debug.verbosity(0) << font.hintingPreference(); break;
        case QFont::StyleNameResolved:
            QFONT_DEBUG_SKIP_DEFAULT(styleName);
            debug << "styleName=" << font.styleName(); break;
        default:
            continue;
        };

        #undef QFONT_DEBUG_SKIP_DEFAULT

        debug << ", ";
    }

    if (stream.verbosity() > QDebug::MinimumVerbosity)
        debug.verbosity(0) << "resolveMask=" << QFlags<QFont::ResolveProperties>(font.resolve_mask);
    else
        fontDescription.chop(2); // Last ', '

    stream << fontDescription << ')';

    return stream;
}